

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

bool helics::changeDetected
               (defV *prevValue,
               vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val,
               double deltaV)

{
  double *pdVar1;
  double *pdVar2;
  pointer pcVar3;
  variant_alternative_t<5UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  double local_48;
  double dStack_40;
  
  bVar7 = true;
  if (((prevValue->
       super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
       ).
       super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       .
       super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       .
       super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       .
       super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       .
       super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       ._M_index == '\x05') &&
     (pvVar4 = std::
               get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         (prevValue),
     (long)(val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish -
     (long)(val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start ==
     (long)(pvVar4->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish -
     (long)(pvVar4->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
           )._M_impl.super__Vector_impl_data._M_start)) {
    uVar6 = 0xffffffffffffffff;
    lVar5 = 0;
    do {
      pcVar3 = (val->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
      bVar7 = uVar6 < (ulong)((long)(val->
                                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3 >> 4)
      ;
      if (!bVar7) {
        return bVar7;
      }
      pdVar1 = (double *)
               (((pvVar4->
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_start)->_M_value + lVar5);
      pdVar2 = (double *)(pcVar3->_M_value + lVar5);
      local_48 = *pdVar1 - *pdVar2;
      dStack_40 = pdVar1[1] - pdVar2[1];
      dVar8 = std::abs<double>((complex<double> *)&local_48);
      lVar5 = lVar5 + 0x10;
    } while (dVar8 <= deltaV);
  }
  return bVar7;
}

Assistant:

bool changeDetected(const defV& prevValue,
                    const std::vector<std::complex<double>>& val,
                    double deltaV)
{
    if (prevValue.index() == complex_vector_loc) {
        const auto& prevV = std::get<std::vector<std::complex<double>>>(prevValue);
        if (val.size() == prevV.size()) {
            for (size_t ii = 0; ii < val.size(); ++ii) {
                if (std::abs(prevV[ii] - val[ii]) > deltaV) {
                    return true;
                }
            }
            return false;
        }
    }
    return true;
}